

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_mov(TCGContext_conflict9 *s,TCGOp *op)

{
  uint uVar1;
  TCGRegSet preferred_regs_00;
  tcg_target_ulong val_00;
  _Bool _Var2;
  TCGType_conflict type;
  TCGReg TVar3;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  tcg_target_ulong val;
  TCGType_conflict itype;
  TCGType_conflict otype;
  TCGTemp *ots;
  TCGTemp *ts;
  uint local_20;
  TCGRegSet preferred_regs;
  TCGRegSet allocated_regs;
  TCGLifeData arg_life;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  uVar1 = *(uint *)op;
  local_20 = s->reserved_regs;
  preferred_regs_00 = op->output_pref[0];
  ts_00 = arg_temp(op->args[0]);
  ts_01 = arg_temp(op->args[1]);
  type = (TCGType_conflict)((ulong)*(undefined8 *)ts_00 >> 0x18) & 0xff;
  if (((uint)((ulong)*(undefined8 *)ts_01 >> 8) & 0xff) == 3) {
    val_00 = ts_01->val;
    if ((uVar1 & 0x80000) != 0) {
      temp_dead(s,ts_01);
    }
    tcg_reg_alloc_do_movi(s,ts_00,val_00,(TCGLifeData)(uVar1 >> 0x10),preferred_regs_00);
  }
  else {
    if (((uint)((ulong)*(undefined8 *)ts_01 >> 8) & 0xff) == 2) {
      temp_load(s,ts_01,s->tcg_target_available_regs
                        [(uint)((ulong)*(undefined8 *)ts_01 >> 0x18) & 0xff],local_20,
                preferred_regs_00);
    }
    if ((uVar1 & 0x40000) == 0) {
      if (((uVar1 & 0x80000) == 0) || ((*(ulong *)ts_01 >> 0x20 & 1) != 0)) {
        if (((uint)((ulong)*(undefined8 *)ts_00 >> 8) & 0xff) != 1) {
          local_20 = 1 << ((byte)*(undefined8 *)ts_01 & 0x1f) | local_20;
          TVar3 = tcg_reg_alloc(s,s->tcg_target_available_regs[type],local_20,preferred_regs_00,
                                (*(ulong *)ts_00 >> 0x22 & 1) != 0);
          *(ulong *)ts_00 = *(ulong *)ts_00 & 0xffffffffffffff00 | (ulong)TVar3 & 0xff;
        }
        _Var2 = tcg_out_mov(s,type,(TCGReg)*(undefined8 *)ts_00 & 0xff,
                            (TCGReg)*(undefined8 *)ts_01 & 0xff);
        if (!_Var2) {
          if ((*(ulong *)ts_00 >> 0x20 & 1) == 0) {
            if ((*(ulong *)ts_01 >> 0x24 & 1) == 0) {
              temp_allocate_frame(s,ts_00);
            }
            tcg_out_st(s,(TCGType_conflict)((ulong)*(undefined8 *)ts_01 >> 0x18) & 0xff,
                       (TCGReg)*(undefined8 *)ts_01 & 0xff,
                       (TCGReg)*(undefined8 *)ts_00->mem_base & 0xff,ts_00->mem_offset);
            *(ulong *)ts_00 = *(ulong *)ts_00 & 0xfffffff7ffffffff | 0x800000000;
            temp_free_or_dead(s,ts_00,-1);
            return;
          }
          __assert_fail("!ots->fixed_reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                        ,0xcb1,"void tcg_reg_alloc_mov(TCGContext *, const TCGOp *)");
        }
      }
      else {
        if (((uint)((ulong)*(undefined8 *)ts_00 >> 8) & 0xff) == 1) {
          s->reg_to_temp[(uint)*(undefined8 *)ts_00 & 0xff] = (TCGTemp *)0x0;
        }
        *(ulong *)ts_00 =
             *(ulong *)ts_00 & 0xffffffffffffff00 | (ulong)((uint)*(undefined8 *)ts_01 & 0xff);
        temp_dead(s,ts_01);
      }
      *(ulong *)ts_00 = *(ulong *)ts_00 & 0xffffffffffff00ff | 0x100;
      *(ulong *)ts_00 = *(ulong *)ts_00 & 0xfffffff7ffffffff;
      s->reg_to_temp[(uint)*(undefined8 *)ts_00 & 0xff] = ts_00;
      if ((uVar1 & 0x10000) != 0) {
        temp_sync(s,ts_00,local_20,0,0);
      }
    }
    else {
      if ((*(ulong *)ts_00 >> 0x24 & 1) == 0) {
        temp_allocate_frame(s,ts_00);
      }
      tcg_out_st(s,type,(TCGReg)*(undefined8 *)ts_01 & 0xff,
                 (TCGReg)*(undefined8 *)ts_00->mem_base & 0xff,ts_00->mem_offset);
      if ((uVar1 & 0x80000) != 0) {
        temp_dead(s,ts_01);
      }
      temp_dead(s,ts_00);
    }
  }
  return;
}

Assistant:

static void tcg_reg_alloc_mov(TCGContext *s, const TCGOp *op)
{
    const TCGLifeData arg_life = op->life;
    TCGRegSet allocated_regs, preferred_regs;
    TCGTemp *ts, *ots;
    TCGType otype, itype;

    allocated_regs = s->reserved_regs;
    preferred_regs = op->output_pref[0];
    ots = arg_temp(op->args[0]);
    ts = arg_temp(op->args[1]);

    /* ENV should not be modified.  */
    tcg_debug_assert(!ots->fixed_reg);

    /* Note that otype != itype for no-op truncation.  */
    otype = ots->type;
    itype = ts->type;

    if (ts->val_type == TEMP_VAL_CONST) {
        /* propagate constant or generate sti */
        tcg_target_ulong val = ts->val;
        if (IS_DEAD_ARG(1)) {
            temp_dead(s, ts);
        }
        tcg_reg_alloc_do_movi(s, ots, val, arg_life, preferred_regs);
        return;
    }

    /* If the source value is in memory we're going to be forced
       to have it in a register in order to perform the copy.  Copy
       the SOURCE value into its own register first, that way we
       don't have to reload SOURCE the next time it is used. */
    if (ts->val_type == TEMP_VAL_MEM) {
        temp_load(s, ts, s->tcg_target_available_regs[itype],
                  allocated_regs, preferred_regs);
    }

    tcg_debug_assert(ts->val_type == TEMP_VAL_REG);
    if (IS_DEAD_ARG(0)) {
        /* mov to a non-saved dead register makes no sense (even with
           liveness analysis disabled). */
        tcg_debug_assert(NEED_SYNC_ARG(0));
        if (!ots->mem_allocated) {
            temp_allocate_frame(s, ots);
        }
        tcg_out_st(s, otype, ts->reg, ots->mem_base->reg, ots->mem_offset);
        if (IS_DEAD_ARG(1)) {
            temp_dead(s, ts);
        }
        temp_dead(s, ots);
    } else {
        if (IS_DEAD_ARG(1) && !ts->fixed_reg) {
            /* the mov can be suppressed */
            if (ots->val_type == TEMP_VAL_REG) {
                s->reg_to_temp[ots->reg] = NULL;
            }
            ots->reg = ts->reg;
            temp_dead(s, ts);
        } else {
            if (ots->val_type != TEMP_VAL_REG) {
                /* When allocating a new register, make sure to not spill the
                   input one. */
                tcg_regset_set_reg(allocated_regs, ts->reg);
                ots->reg = tcg_reg_alloc(s, s->tcg_target_available_regs[otype],
                                         allocated_regs, preferred_regs,
                                         ots->indirect_base);
            }
            if (!tcg_out_mov(s, otype, ots->reg, ts->reg)) {
                /*
                 * Cross register class move not supported.
                 * Store the source register into the destination slot
                 * and leave the destination temp as TEMP_VAL_MEM.
                 */
                assert(!ots->fixed_reg);
                if (!ts->mem_allocated) {
                    temp_allocate_frame(s, ots);
                }
                tcg_out_st(s, ts->type, ts->reg,
                           ots->mem_base->reg, ots->mem_offset);
                ots->mem_coherent = 1;
                temp_free_or_dead(s, ots, -1);
                return;
            }
        }
        ots->val_type = TEMP_VAL_REG;
        ots->mem_coherent = 0;
        s->reg_to_temp[ots->reg] = ots;
        if (NEED_SYNC_ARG(0)) {
            temp_sync(s, ots, allocated_regs, 0, 0);
        }
    }
}